

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O2

void duckdb::PhysicalExport::ExtractEntries
               (ClientContext *context,
               vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *schema_list,
               ExportEntries *result)

{
  SchemaCatalogEntry *pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer prVar4;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  pointer local_38;
  
  local_38 = (schema_list->
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ).
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar4 = (schema_list->
                super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ).
                super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar4 != local_38; prVar4 = prVar4 + 1)
  {
    pSVar1 = prVar4->_M_data;
    iVar3 = (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0xb])(pSVar1);
    bVar2 = Catalog::IsSystemCatalog((Catalog *)CONCAT44(extraout_var,iVar3));
    if (!bVar2) {
      bVar2 = Catalog::IsTemporaryCatalog((Catalog *)CONCAT44(extraout_var,iVar3));
      if (!bVar2) {
        if ((pSVar1->super_InCatalogEntry).super_CatalogEntry.internal == false) {
          local_58._M_unused._0_8_ = (undefined8)pSVar1;
          ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
          ::emplace_back<std::reference_wrapper<duckdb::CatalogEntry>>
                    ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                      *)result,(reference_wrapper<duckdb::CatalogEntry> *)&local_58);
        }
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:139:50)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:139:50)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,1,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:150:53)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:150:53)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,6,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:156:49)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:156:49)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,8,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:162:50)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:162:50)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,4,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:168:50)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:168:50)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,0x1e,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        local_58._8_8_ = 0;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:173:56)>
                   ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_export.cpp:173:56)>
                   ::_M_manager;
        local_58._M_unused._M_object = result;
        (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                  (pSVar1,context,0x1f,&local_58);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
      }
    }
  }
  return;
}

Assistant:

void PhysicalExport::ExtractEntries(ClientContext &context, vector<reference<SchemaCatalogEntry>> &schema_list,
                                    ExportEntries &result) {
	for (auto &schema_p : schema_list) {
		auto &schema = schema_p.get();
		auto &catalog = schema.ParentCatalog();
		if (catalog.IsSystemCatalog() || catalog.IsTemporaryCatalog()) {
			continue;
		}
		if (!schema.internal) {
			result.schemas.push_back(schema);
		}
		schema.Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.internal) {
				return;
			}
			if (entry.type != CatalogType::TABLE_ENTRY) {
				result.views.push_back(entry);
			}
			if (entry.type == CatalogType::TABLE_ENTRY) {
				result.tables.push_back(entry);
			}
		});
		schema.Scan(context, CatalogType::SEQUENCE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.internal) {
				return;
			}
			result.sequences.push_back(entry);
		});
		schema.Scan(context, CatalogType::TYPE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.internal) {
				return;
			}
			result.custom_types.push_back(entry);
		});
		schema.Scan(context, CatalogType::INDEX_ENTRY, [&](CatalogEntry &entry) {
			if (entry.internal) {
				return;
			}
			result.indexes.push_back(entry);
		});
		schema.Scan(context, CatalogType::MACRO_ENTRY, [&](CatalogEntry &entry) {
			if (!entry.internal && entry.type == CatalogType::MACRO_ENTRY) {
				result.macros.push_back(entry);
			}
		});
		schema.Scan(context, CatalogType::TABLE_MACRO_ENTRY, [&](CatalogEntry &entry) {
			if (!entry.internal && entry.type == CatalogType::TABLE_MACRO_ENTRY) {
				result.macros.push_back(entry);
			}
		});
	}
}